

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

PCMI VIRTUALFindRegionInformation(UINT_PTR address)

{
  PCMI local_20;
  PCMI pEntry;
  UINT_PTR address_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((pVirtualMemoryLastFound == (PCMI)0x0) || (address < pVirtualMemoryLastFound->startBoundary))
  {
    local_20 = pVirtualMemory;
  }
  else {
    local_20 = pVirtualMemoryLastFound;
    if (pVirtualMemoryLastFound->startBoundary == address) {
      return pVirtualMemoryLastFound;
    }
  }
  do {
    if (local_20 == (PCMI)0x0) {
LAB_0023fc51:
      if (local_20 != (PCMI)0x0) {
        pVirtualMemoryLastFound = local_20;
      }
      return local_20;
    }
    if (address < local_20->startBoundary) {
      local_20 = (PCMI)0x0;
      goto LAB_0023fc51;
    }
    if (address < local_20->startBoundary + local_20->memSize) goto LAB_0023fc51;
    local_20 = local_20->pNext;
  } while( true );
}

Assistant:

static PCMI VIRTUALFindRegionInformation( IN UINT_PTR address )
{
    PCMI pEntry = NULL;

    TRACE( "VIRTUALFindRegionInformation( %#x )\n", address );

    pEntry = pVirtualMemory;

    if (pVirtualMemoryLastFound && pVirtualMemoryLastFound->startBoundary <= address)
    {
        pEntry = pVirtualMemoryLastFound;
        if (pEntry->startBoundary == address)
        {
            return pEntry;
        }
    }
    else
    {
        pEntry = pVirtualMemory;
    }

    while( pEntry )
    {
        if ( pEntry->startBoundary > address )
        {
            /* Gone past the possible location in the list. */
            pEntry = NULL;
            break;
        }
        if ( pEntry->startBoundary + pEntry->memSize > address )
        {
            break;
        }

        pEntry = pEntry->pNext;
    }

    if (pEntry) pVirtualMemoryLastFound = pEntry;
    return pEntry;
}